

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.c
# Opt level: O2

void basic_tests(zt_unit_test *test,void *data)

{
  int iVar1;
  zt_log_ty *log;
  FILE *__stream;
  char *pcVar2;
  undefined1 auVar3 [16];
  undefined8 uStack_850;
  int date;
  int pid;
  zt_log_ty *local_840;
  char msg [255];
  char sysname [255];
  char time [255];
  char month [255];
  char progname [255];
  char level [255];
  char position2 [255];
  char position1 [255];
  
  log = zt_log_file("log.err",0,0x1f);
  zt_progname("./unit_test",1);
  local_840 = zt_log_logger(log);
  zt_log_set_opts(log,0);
  zt_log_lprintf((zt_log_ty *)0x0,zt_log_debug,"ZT_LOG_RAW");
  zt_log_set_opts(log,1);
  zt_log_lprintf((zt_log_ty *)0x0,zt_log_debug,"ZT_LOG_WITH_DATE");
  zt_log_set_opts(log,2);
  zt_log_lprintf((zt_log_ty *)0x0,zt_log_debug,"ZT_LOG_WITH_LEVEL");
  zt_log_set_opts(log,4);
  zt_log_lprintf((zt_log_ty *)0x0,zt_log_debug,"ZT_LOG_WITH_SYSNAME");
  zt_log_set_opts(log,0xc);
  zt_log_lprintf((zt_log_ty *)0x0,zt_log_debug,"ZT_LOG_WITH_SYSNAME | ZT_LOG_WITH_PROGNAME");
  zt_log_set_opts(log,8);
  zt_log_lprintf((zt_log_ty *)0x0,zt_log_debug,"ZT_LOG_WITH_PROGNAME");
  zt_log_set_opts(log,0x10);
  zt_log_lprintf((zt_log_ty *)0x0,zt_log_debug,"ZT_LOG_WITH_PID");
  zt_log_set_opts(log,0x1d);
  zt_log_lprintf((zt_log_ty *)0x0,zt_log_debug,"ZT_LOG_EMU_SYSLOG");
  zt_log_set_opts(log,0);
  sprintf(position1,"(%s:%d)",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/log_test.c"
          ,0x3e);
  sprintf(position2,"(%s:%d)",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/log_test.c"
          ,0x3f);
  zt_log_set_debug_info
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/log_test.c"
             ,0x3f,"basic_tests");
  zt_log_lprintf(log,zt_log_debug,"lprintf with debugging");
  zt_log_logger(local_840);
  zt_log_close(log);
  __stream = fopen("log.err","r");
  pid = 0;
  date = 0;
  if (__stream == (FILE *)0x0) {
    pcVar2 = "(file)";
    uStack_850 = 0x51;
  }
  else {
    zt_unit_test_add_assertion(test);
    iVar1 = __isoc99_fscanf(__stream,"%s\n",msg);
    if (iVar1 == 1) {
      iVar1 = bcmp(msg,"ZT_LOG_RAW",0xb);
      if (iVar1 == 0) {
        zt_unit_test_add_assertion(test);
        iVar1 = __isoc99_fscanf(__stream,"%s %d %s : %s\n",month,&date,time,msg);
        if (iVar1 == 4) {
          iVar1 = bcmp(msg,"ZT_LOG_WITH_DATE",0x11);
          if (iVar1 == 0) {
            zt_unit_test_add_assertion(test);
            iVar1 = __isoc99_fscanf(__stream,"%s %s\n",level,msg);
            if (iVar1 == 2) {
              iVar1 = bcmp(msg,"ZT_LOG_WITH_LEVEL",0x12);
              if (iVar1 == 0) {
                zt_unit_test_add_assertion(test);
                iVar1 = __isoc99_fscanf(__stream,"%s %s\n",sysname,msg);
                if (iVar1 == 2) {
                  iVar1 = bcmp(msg,"ZT_LOG_WITH_SYSNAME",0x14);
                  if (iVar1 == 0) {
                    zt_unit_test_add_assertion(test);
                    iVar1 = __isoc99_fscanf(__stream,"%s %s %[A-Z_| ]\n",sysname,progname,msg);
                    if (iVar1 == 3) {
                      iVar1 = bcmp(msg,"ZT_LOG_WITH_SYSNAME | ZT_LOG_WITH_PROGNAME",0x2b);
                      if (iVar1 == 0) {
                        zt_unit_test_add_assertion(test);
                        iVar1 = __isoc99_fscanf(__stream,"%s %s\n",progname,msg);
                        if (iVar1 == 2) {
                          iVar1 = bcmp(msg,"ZT_LOG_WITH_PROGNAME",0x15);
                          if (iVar1 == 0) {
                            zt_unit_test_add_assertion(test);
                            iVar1 = __isoc99_fscanf(__stream,"[%d]: %s\n",&pid,msg);
                            if ((iVar1 == 2) &&
                               (auVar3[0] = -(msg[0] == 'Z'), auVar3[1] = -(msg[1] == 'T'),
                               auVar3[2] = -(msg[2] == '_'), auVar3[3] = -(msg[3] == 'L'),
                               auVar3[4] = -(msg[4] == 'O'), auVar3[5] = -(msg[5] == 'G'),
                               auVar3[6] = -(msg[6] == '_'), auVar3[7] = -(msg[7] == 'W'),
                               auVar3[8] = -(msg[8] == 'I'), auVar3[9] = -(msg[9] == 'T'),
                               auVar3[10] = -(msg[10] == 'H'), auVar3[0xb] = -(msg[0xb] == '_'),
                               auVar3[0xc] = -(msg[0xc] == 'P'), auVar3[0xd] = -(msg[0xd] == 'I'),
                               auVar3[0xe] = -(msg[0xe] == 'D'), auVar3[0xf] = -(msg[0xf] == '\0'),
                               (ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) |
                                        (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                                        (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                                        (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                                        (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                                        (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                                        (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                                        (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                                        (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                                        (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                                        (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                                        (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                                        (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                                        (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                                        (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
                                       (ushort)(auVar3[0xf] >> 7) << 0xf) == 0xffff)) {
                              zt_unit_test_add_assertion(test);
                              iVar1 = __isoc99_fscanf(__stream,"%s %d %s %s %[a-zA-Z_-][%d]: %s\n",
                                                      month,&date,time,sysname,progname,&pid,msg);
                              if (iVar1 == 7) {
                                iVar1 = bcmp(msg,"ZT_LOG_EMU_SYSLOG",0x12);
                                if (iVar1 == 0) {
                                  zt_unit_test_add_assertion(test);
                                  fclose(__stream);
                                  return;
                                }
                              }
                              pcVar2 = "((items == 7) && (!strcmp(msg, \"ZT_LOG_EMU_SYSLOG\")))";
                              uStack_850 = 0x6b;
                            }
                            else {
                              pcVar2 = "((items == 2) && (!strcmp(msg, \"ZT_LOG_WITH_PID\")))";
                              uStack_850 = 0x68;
                            }
                            goto LAB_001107fb;
                          }
                        }
                        pcVar2 = "((items == 2) && (!strcmp(msg, \"ZT_LOG_WITH_PROGNAME\")))";
                        uStack_850 = 0x65;
                        goto LAB_001107fb;
                      }
                    }
                    pcVar2 = 
                    "((items == 3) && (!strcmp(msg, \"ZT_LOG_WITH_SYSNAME | ZT_LOG_WITH_PROGNAME\")))"
                    ;
                    uStack_850 = 0x61;
                    goto LAB_001107fb;
                  }
                }
                pcVar2 = "((items == 2) && (!strcmp(msg, \"ZT_LOG_WITH_SYSNAME\")))";
                uStack_850 = 0x5e;
                goto LAB_001107fb;
              }
            }
            pcVar2 = "((items == 2) && (!strcmp(msg, \"ZT_LOG_WITH_LEVEL\")))";
            uStack_850 = 0x5a;
            goto LAB_001107fb;
          }
        }
        pcVar2 = "((items == 4) && (!strcmp(msg, \"ZT_LOG_WITH_DATE\")))";
        uStack_850 = 0x57;
        goto LAB_001107fb;
      }
    }
    pcVar2 = "((items == 1) && (!strcmp(msg, \"ZT_LOG_RAW\")))";
    uStack_850 = 0x54;
  }
LAB_001107fb:
  iVar1 = zt_unit_printf(&test->error,"%s : %s:%d",pcVar2,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/log_test.c"
                         ,uStack_850);
  if (iVar1 == 0) {
    test->error = (char *)0x0;
  }
  longjmp((__jmp_buf_tag *)test->env,1);
}

Assistant:

static void
basic_tests(struct zt_unit_test *test, void *data UNUSED)
{
    char          position1[255];
    char          position2[255];
    zt_log_ty   * logger;
    /* zt_log_ty *lstderr = zt_log_stderr((ZT_LOG_WITH_PROGNAME | ZT_LOG_WITH_LEVEL));  */
    zt_log_ty   * lfile = zt_log_file( "log.err",
                                      ZT_LOG_FILE_OVERWRITE,
                                      (ZT_LOG_EMU_SYSLOG | ZT_LOG_WITH_LEVEL));

    /*    zt_log_ty *lsyslog = zt_log_syslog(LOG_PID, LOG_DAEMON, ZT_LOG_RAW); */

    zt_progname("."PATH_SEPERATOR"unit_test", STRIP_DIR);

    /* capture the standard logger and set to the new logger */
    logger = zt_log_logger(lfile);

    zt_log_set_opts(lfile, (ZT_LOG_RAW));
    zt_log_printf( zt_log_debug, "ZT_LOG_RAW" );

    zt_log_set_opts(lfile, (ZT_LOG_WITH_DATE));
    zt_log_printf( zt_log_debug, "ZT_LOG_WITH_DATE" );

    zt_log_set_opts(lfile, (ZT_LOG_WITH_LEVEL));
    zt_log_printf( zt_log_debug, "ZT_LOG_WITH_LEVEL" );

    zt_log_set_opts(lfile, (ZT_LOG_WITH_SYSNAME));
    zt_log_printf( zt_log_debug, "ZT_LOG_WITH_SYSNAME" );

    zt_log_set_opts(lfile, (ZT_LOG_WITH_SYSNAME | ZT_LOG_WITH_PROGNAME));
    zt_log_printf( zt_log_debug, "ZT_LOG_WITH_SYSNAME | ZT_LOG_WITH_PROGNAME" );

    zt_log_set_opts(lfile, (ZT_LOG_WITH_PROGNAME));
    zt_log_printf( zt_log_debug, "ZT_LOG_WITH_PROGNAME" );

    zt_log_set_opts(lfile, (ZT_LOG_WITH_PID));
    zt_log_printf( zt_log_debug, "ZT_LOG_WITH_PID" );

    zt_log_set_opts(lfile, (ZT_LOG_EMU_SYSLOG));
    zt_log_printf( zt_log_debug, "ZT_LOG_EMU_SYSLOG" );

    zt_log_set_opts(lfile, (ZT_LOG_RAW));

    /* these need to be on the same line for the test to work */
    sprintf(position1, "(%s:%d)", __FILE__, __LINE__); ZT_LOG_XDEBUG( "LOG_DEBUG" );
    sprintf(position2, "(%s:%d)", __FILE__, __LINE__); ZT_LOG_DEBUG_INFO(), zt_log_lprintf(lfile, zt_log_debug, "lprintf with debugging");

    /* reset to the default logger */
    zt_log_logger(logger);

    zt_log_close(lfile);

    {
        FILE *file = fopen("log.err", "r");
        int   items = 0;
        char  msg[255];
        char  level[255];
        char  sysname[255];
        char  progname[255];
        int   pid = 0;
        char  month[255];
        int   date = 0;
        char  time[255];
        ZT_UNIT_ASSERT(test, (file));
        items = fscanf(file, "%s\n", msg);
        ZT_UNIT_ASSERT(test, ((items == 1) &&
                              (!strcmp(msg, "ZT_LOG_RAW"))));
        items = fscanf(file, "%s %d %s : %s\n", month, &date, time, msg);
        ZT_UNIT_ASSERT(test, ((items == 4) &&
                              (!strcmp(msg, "ZT_LOG_WITH_DATE"))));
        items = fscanf(file, "%s %s\n", level, msg);
        ZT_UNIT_ASSERT(test, ((items == 2) &&
                              (!strcmp(msg, "ZT_LOG_WITH_LEVEL"))));

        items = fscanf(file, "%s %s\n", sysname, msg);
        ZT_UNIT_ASSERT(test, ((items == 2) &&
                              (!strcmp(msg, "ZT_LOG_WITH_SYSNAME"))));
        items = fscanf(file, "%s %s %[A-Z_| ]\n", sysname, progname, msg);
        ZT_UNIT_ASSERT(test, ((items == 3) &&
                              (!strcmp(msg, "ZT_LOG_WITH_SYSNAME | ZT_LOG_WITH_PROGNAME"))));

        items = fscanf(file, "%s %s\n", progname, msg);
        ZT_UNIT_ASSERT(test, ((items == 2) &&
                              (!strcmp(msg, "ZT_LOG_WITH_PROGNAME"))));
        items = fscanf(file, "[%d]: %s\n", &pid, msg);
        ZT_UNIT_ASSERT(test, ((items == 2) &&
                              (!strcmp(msg, "ZT_LOG_WITH_PID"))));
        items = fscanf(file, "%s %d %s %s %[a-zA-Z_-][%d]: %s\n", month, &date, time, sysname, progname, &pid, msg);
        ZT_UNIT_ASSERT(test, ((items == 7) &&
                              (!strcmp(msg, "ZT_LOG_EMU_SYSLOG"))));
#ifdef DEBUG
        items = fscanf(file, "LOG_DEBUG: in basic_tests at %s\n", msg);
        ZT_UNIT_ASSERT(test, ((items == 1) &&
                              (!strcmp(msg, position1))));
#endif

#if 0
        /* issues with paths with spaces in them */
        items = fscanf(file, "lprintf with debugging: in basic_tests at %s\n", msg);
        ZT_UNIT_ASSERT(test, ((items == 1) &&
                              (!strcmp(msg, position2))));
#endif
        fclose(file);
        /* unlink("log.err"); */
    }
}